

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void drawnumber_getbuf(t_drawnumber *x,t_word *data,t_template *template,char *buf)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  int onset;
  int type;
  t_symbol *arraytype;
  int local_48;
  uint local_44;
  t_atom local_40;
  
  iVar1 = template_find_field(template,x->x_fieldname,&local_48,(int *)&local_44,
                              (t_symbol **)&local_40);
  uVar3 = 0xffffffff;
  if (local_44 != 3) {
    uVar3 = local_44;
  }
  uVar3 = uVar3 | -(uint)(iVar1 == 0);
  if ((int)uVar3 < 0) {
    *buf = '\0';
  }
  else {
    strncpy(buf,x->x_label->s_name,0x400);
    buf[0x3ff] = '\0';
    sVar2 = strlen(buf);
    iVar1 = (int)sVar2;
    if (uVar3 == 2) {
      binbuf_gettext(*(_binbuf **)((long)data + (long)local_48),(char **)&local_40,(int *)&local_44)
      ;
      uVar3 = 0x3ffU - iVar1;
      if ((int)local_44 < (int)(0x3ffU - iVar1)) {
        uVar3 = local_44;
      }
      memcpy(buf + iVar1,(void *)CONCAT44(local_40._4_4_,local_40.a_type),(long)(int)uVar3);
      buf[(int)(uVar3 + iVar1)] = '\0';
      if (uVar3 + iVar1 == 0x3ff) {
        builtin_strncpy(buf + 0x3fc,"...",4);
      }
      freebytes((void *)CONCAT44(local_40._4_4_,local_40.a_type),(long)(int)local_44);
    }
    else {
      if (uVar3 == 0) {
        local_40.a_type = A_FLOAT;
        local_40.a_w.w_float = (t_float)*(undefined4 *)((long)data + (long)local_48);
      }
      else {
        if (uVar3 == 1) {
          strncpy(buf + iVar1,(char *)**(undefined8 **)((long)data + (long)local_48),
                  (long)(0x400 - iVar1));
          return;
        }
        local_40.a_type = A_SYMBOL;
        local_40.a_w = *(word *)((long)data + (long)local_48);
      }
      atom_string(&local_40,buf + iVar1,0x400 - iVar1);
    }
  }
  return;
}

Assistant:

static void drawnumber_getbuf(t_drawnumber *x, t_word *data,
    t_template *template, char *buf)
{
    int nchars, onset, type = drawnumber_gettype(x, data, template, &onset);
    if (type < 0)
        buf[0] = 0;
    else
    {
        strncpy(buf, x->x_label->s_name, DRAWNUMBER_BUFSIZE);
        buf[DRAWNUMBER_BUFSIZE - 1] = 0;
        nchars = (int)strlen(buf);
        if (type == DT_TEXT)
        {
            char *buf2;
            int size2, ncopy;
            binbuf_gettext(((t_word *)((char *)data + onset))->w_binbuf,
                &buf2, &size2);
            ncopy = (size2 > DRAWNUMBER_BUFSIZE-1-nchars ?
                DRAWNUMBER_BUFSIZE-1-nchars: size2);
            memcpy(buf+nchars, buf2, ncopy);
            buf[nchars+ncopy] = 0;
            if (nchars+ncopy == DRAWNUMBER_BUFSIZE-1)
                strcpy(buf+(DRAWNUMBER_BUFSIZE-4), "...");
            t_freebytes(buf2, size2);
        }
        else
        {
            t_atom at;
            switch(type)
            {
            default:
                SETSYMBOL(&at, ((t_word *)((char *)data + onset))->w_symbol);
                atom_string(&at, buf + nchars, DRAWNUMBER_BUFSIZE - nchars);
                break;
            case DT_FLOAT:
                SETFLOAT(&at, ((t_word *)((char *)data + onset))->w_float);
                atom_string(&at, buf + nchars, DRAWNUMBER_BUFSIZE - nchars);
                break;
            case DT_SYMBOL:
                strncpy(buf + nchars,
                    ((t_word *)((char *)data + onset))->w_symbol->s_name,
                    DRAWNUMBER_BUFSIZE - nchars);
            }
        }
    }
}